

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::TableScanInitGlobal(ClientContext *context,TableFunctionInitInput *input)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  DuckTableEntry *this;
  undefined4 extraout_var;
  size_type sVar4;
  DataTableInfo *pDVar5;
  DBConfig *this_00;
  TableFunctionInitInput *input_00;
  DataTable *storage_00;
  TableScanBindData *bind_data_00;
  TableIndexList *this_01;
  ClientContext *context_00;
  long in_RDX;
  DataTableInfo *in_RSI;
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  in_RDI;
  ClientContext *context_01;
  undefined1 auVar6 [16];
  unsafe_vector<row_t> row_ids;
  bool index_scan;
  ColumnList *column_list;
  unsigned_long max_count;
  unsigned_long total_rows_from_percentage;
  idx_t total_rows;
  RETURN_TYPE scan_max_count;
  RETURN_TYPE_conflict scan_percentage;
  DBConfig *db_config;
  TableIndexList *indexes;
  shared_ptr<duckdb::DataTableInfo,_true> *info;
  shared_ptr<duckdb::CheckpointLock,_true> checkpoint_lock;
  DuckTransaction *transaction;
  TableFilterSet *filter_set;
  DataTable *storage;
  DuckTableEntry *duck_table;
  TableScanBindData *bind_data;
  AttachedDatabase *in_stack_fffffffffffffe68;
  ClientContext *in_stack_fffffffffffffe70;
  TableIndexList *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffec8;
  DataTableInfo *in_stack_ffffffffffffff50;
  DuckTransaction *in_stack_ffffffffffffff58;
  TableScanBindData *in_stack_ffffffffffffff60;
  DataTable *in_stack_ffffffffffffff68;
  TableFunctionInitInput *in_stack_ffffffffffffff70;
  ClientContext *in_stack_ffffffffffffff78;
  
  optional_ptr<const_duckdb::FunctionData,_true>::operator->
            ((optional_ptr<const_duckdb::FunctionData,_true> *)in_stack_fffffffffffffe70);
  FunctionData::Cast<duckdb::TableScanBindData>((FunctionData *)in_stack_fffffffffffffe70);
  this = CatalogEntry::Cast<duckdb::DuckTableEntry>((CatalogEntry *)in_stack_fffffffffffffe70);
  iVar3 = (*(this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])();
  bVar1 = optional_ptr::operator_cast_to_bool((optional_ptr *)(in_RDX + 0x50));
  if (bVar1) {
    optional_ptr<duckdb::TableFilterSet,_true>::operator*
              ((optional_ptr<duckdb::TableFilterSet,_true> *)in_stack_fffffffffffffe70);
    sVar4 = ::std::
            map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
            ::size((map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
                    *)0x1490dee);
    if (sVar4 == 1) {
      DuckTransaction::Get(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      DataTable::GetDataTableInfo((DataTable *)CONCAT44(extraout_var,iVar3));
      shared_ptr<duckdb::DataTableInfo,_true>::operator*
                ((shared_ptr<duckdb::DataTableInfo,_true> *)in_stack_fffffffffffffe70);
      DuckTransaction::SharedLockTable(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      DataTable::GetDataTableInfo((DataTable *)CONCAT44(extraout_var,iVar3));
      pDVar5 = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                         ((shared_ptr<duckdb::DataTableInfo,_true> *)in_stack_fffffffffffffe70);
      this_00 = (DBConfig *)DataTableInfo::GetIndexes(pDVar5);
      uVar2 = TableIndexList::Empty(in_stack_fffffffffffffe80);
      if ((bool)uVar2) {
        DuckTableScanInitGlobal
                  (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   in_stack_ffffffffffffff60);
      }
      else {
        DBConfig::GetConfig((ClientContext *)0x1490f59);
        context_01 = (ClientContext *)
                     DBConfig::GetSetting<duckdb::IndexScanPercentageSetting>
                               (this_00,(ClientContext *)CONCAT17(uVar2,in_stack_fffffffffffffec8));
        input_00 = (TableFunctionInitInput *)
                   DBConfig::GetSetting<duckdb::IndexScanMaxCountSetting>
                             (this_00,(ClientContext *)CONCAT17(uVar2,in_stack_fffffffffffffec8));
        storage_00 = (DataTable *)DataTable::GetTotalRows((DataTable *)0x1490fcf);
        auVar6._8_4_ = (int)((ulong)storage_00 >> 0x20);
        auVar6._0_8_ = storage_00;
        auVar6._12_4_ = 0x45300000;
        bind_data_00 = (TableScanBindData *)
                       LossyNumericCast<unsigned_long,double>
                                 (((auVar6._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)storage_00) - 4503599627370496.0
                                  )) * (double)context_01);
        MaxValue<unsigned_long>((unsigned_long)input_00,(unsigned_long)bind_data_00);
        TableCatalogEntry::GetColumns(&this->super_TableCatalogEntry);
        vector<long,_false>::vector((vector<long,_false> *)0x1491093);
        pDVar5 = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                           ((shared_ptr<duckdb::DataTableInfo,_true> *)in_stack_fffffffffffffe70);
        this_01 = DataTableInfo::GetIndexes(pDVar5);
        context_00 = (ClientContext *)
                     shared_ptr<duckdb::DataTableInfo,_true>::operator*
                               ((shared_ptr<duckdb::DataTableInfo,_true> *)in_RSI);
        TableIndexList::
        BindAndScan<duckdb::ART,duckdb::TableScanInitGlobal(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>
                  (this_01,context_00,in_RSI,(anon_class_48_6_7d8b43b8 *)in_stack_fffffffffffffe68);
        DuckTableScanInitGlobal(context_01,input_00,storage_00,bind_data_00);
        vector<long,_false>::~vector((vector<long,_false> *)0x1491207);
      }
      shared_ptr<duckdb::CheckpointLock,_true>::~shared_ptr
                ((shared_ptr<duckdb::CheckpointLock,_true> *)0x1491214);
    }
    else {
      DuckTableScanInitGlobal
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60);
    }
  }
  else {
    DuckTableScanInitGlobal
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> TableScanInitGlobal(ClientContext &context, TableFunctionInitInput &input) {
	D_ASSERT(input.bind_data);

	auto &bind_data = input.bind_data->Cast<TableScanBindData>();
	auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
	auto &storage = duck_table.GetStorage();

	// Can't index scan without filters.
	if (!input.filters) {
		return DuckTableScanInitGlobal(context, input, storage, bind_data);
	}
	auto &filter_set = *input.filters;

	// FIXME: We currently only support scanning one ART with one filter.
	// If multiple filters exist, i.e., a = 11 AND b = 24, we need to
	// 1.	1.1. Find + scan one ART for a = 11.
	//		1.2. Find + scan one ART for b = 24.
	//		1.3. Return the intersecting row IDs.
	// 2. (Reorder and) scan a single ART with a compound key of (a, b).
	if (filter_set.filters.size() != 1) {
		return DuckTableScanInitGlobal(context, input, storage, bind_data);
	}

	// The checkpoint lock ensures that we do not checkpoint while scanning this table.
	auto &transaction = DuckTransaction::Get(context, storage.db);
	auto checkpoint_lock = transaction.SharedLockTable(*storage.GetDataTableInfo());
	auto &info = storage.GetDataTableInfo();
	auto &indexes = info->GetIndexes();
	if (indexes.Empty()) {
		return DuckTableScanInitGlobal(context, input, storage, bind_data);
	}

	auto &db_config = DBConfig::GetConfig(context);
	auto scan_percentage = db_config.GetSetting<IndexScanPercentageSetting>(context);
	auto scan_max_count = db_config.GetSetting<IndexScanMaxCountSetting>(context);

	auto total_rows = storage.GetTotalRows();
	auto total_rows_from_percentage = LossyNumericCast<idx_t>(double(total_rows) * scan_percentage);
	auto max_count = MaxValue(scan_max_count, total_rows_from_percentage);

	auto &column_list = duck_table.GetColumns();
	bool index_scan = false;
	unsafe_vector<row_t> row_ids;

	info->GetIndexes().BindAndScan<ART>(context, *info, [&](ART &art) {
		index_scan = TryScanIndex(art, column_list, input, filter_set, max_count, row_ids);
		return index_scan;
	});

	if (!index_scan) {
		return DuckTableScanInitGlobal(context, input, storage, bind_data);
	}
	return DuckIndexScanInitGlobal(context, input, bind_data, row_ids);
}